

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

void __thiscall spv::Function::~Function(Function *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Instruction *pIVar3;
  pointer ppIVar4;
  pointer ppBVar5;
  pointer ppIVar6;
  pointer ppBVar7;
  long lVar8;
  
  this->_vptr_Function = (_func_int **)&PTR__Function_00927ec8;
  ppIVar4 = (this->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar6 = (this->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppIVar6 - (long)ppIVar4) >> 3)) {
    lVar8 = 0;
    do {
      if (ppIVar4[lVar8] != (Instruction *)0x0) {
        (*ppIVar4[lVar8]->_vptr_Instruction[1])();
        ppIVar4 = (this->parameterInstructions).
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppIVar6 = (this->parameterInstructions).
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)((ulong)((long)ppIVar6 - (long)ppIVar4) >> 3));
  }
  ppBVar5 = (this->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppBVar7 = (this->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppBVar7 - (long)ppBVar5) >> 3)) {
    lVar8 = 0;
    do {
      if (ppBVar5[lVar8] != (Block *)0x0) {
        (*ppBVar5[lVar8]->_vptr_Block[1])();
        ppBVar5 = (this->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppBVar7 = (this->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)((ulong)((long)ppBVar7 - (long)ppBVar5) >> 3));
  }
  pcVar2 = (this->exportName)._M_dataplus._M_p;
  paVar1 = &(this->exportName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase
            (&(this->reducedPrecisionParams)._M_t,
             (_Link_type)
             (this->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ppBVar5 = (this->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppBVar5 != (pointer)0x0) {
    operator_delete(ppBVar5,(long)(this->blocks).
                                  super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar5)
    ;
  }
  ppIVar4 = (this->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar4 != (pointer)0x0) {
    operator_delete(ppIVar4,(long)(this->parameterInstructions).
                                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar4
                   );
  }
  Instruction::~Instruction(&this->functionInstruction);
  pIVar3 = (this->lineInstruction)._M_t.
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  if (pIVar3 != (Instruction *)0x0) {
    (*pIVar3->_vptr_Instruction[1])();
  }
  (this->lineInstruction)._M_t.
  super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  return;
}

Assistant:

virtual ~Function()
    {
        for (int i = 0; i < (int)parameterInstructions.size(); ++i)
            delete parameterInstructions[i];

        for (int i = 0; i < (int)blocks.size(); ++i)
            delete blocks[i];
    }